

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_types.cpp
# Opt level: O2

UniValue * __thiscall CBanEntry::ToJson(UniValue *__return_storage_ptr__,CBanEntry *this)

{
  long in_FS_OFFSET;
  string in_stack_fffffffffffffe48;
  UniValue in_stack_fffffffffffffe68;
  UniValue local_130;
  string local_d8 [32];
  UniValue local_b8;
  string local_60 [32];
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30 [16];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = local_30;
  local_38 = 0;
  local_30[0] = 0;
  UniValue::UniValue(__return_storage_ptr__,VOBJ,in_stack_fffffffffffffe48);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            (local_60,"version",(allocator<char> *)&stack0xfffffffffffffe57);
  UniValue::UniValue<const_int_&,_int,_true>(&local_b8,&this->nVersion);
  UniValue::pushKV(__return_storage_ptr__,in_stack_fffffffffffffe48,in_stack_fffffffffffffe68);
  UniValue::~UniValue(&local_b8);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::string<std::allocator<char>>
            (local_d8,"ban_created",(allocator<char> *)&stack0xfffffffffffffe57);
  UniValue::UniValue<const_long_&,_long,_true>(&local_130,&this->nCreateTime);
  UniValue::pushKV(__return_storage_ptr__,in_stack_fffffffffffffe48,in_stack_fffffffffffffe68);
  UniValue::~UniValue(&local_130);
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffeb0,"banned_until",
             (allocator<char> *)&stack0xfffffffffffffe57);
  UniValue::UniValue<const_long_&,_long,_true>
            ((UniValue *)&stack0xfffffffffffffe58,&this->nBanUntil);
  UniValue::pushKV(__return_storage_ptr__,in_stack_fffffffffffffe48,in_stack_fffffffffffffe68);
  UniValue::~UniValue((UniValue *)&stack0xfffffffffffffe58);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffeb0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

UniValue CBanEntry::ToJson() const
{
    UniValue json(UniValue::VOBJ);
    json.pushKV(BANMAN_JSON_VERSION_KEY, nVersion);
    json.pushKV("ban_created", nCreateTime);
    json.pushKV("banned_until", nBanUntil);
    return json;
}